

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O2

void testutil_random_fe_non_zero_test(secp256k1_fe *fe)

{
  int iVar1;
  
  do {
    testutil_random_fe_test(fe);
    iVar1 = secp256k1_fe_impl_is_zero(fe);
  } while (iVar1 != 0);
  return;
}

Assistant:

static void testutil_random_fe_non_zero_test(secp256k1_fe *fe) {
    do {
        testutil_random_fe_test(fe);
    } while(secp256k1_fe_is_zero(fe));
}